

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_parse_input(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r)

{
  int iVar1;
  mpc_err_t *p_00;
  char *pcVar2;
  char **ppcVar3;
  void *pvVar4;
  int j;
  long lVar5;
  mpc_err_t *e;
  mpc_err_t *local_30;
  
  local_30 = mpc_err_fail(i,"Unknown Error");
  (local_30->state).col = -1;
  *(undefined4 *)&(local_30->state).pos = 0xffffffff;
  *(undefined4 *)((long)&(local_30->state).pos + 4) = 0xffffffff;
  *(undefined4 *)&(local_30->state).row = 0xffffffff;
  *(undefined4 *)((long)&(local_30->state).row + 4) = 0xffffffff;
  (local_30->state).term = 0;
  iVar1 = mpc_parse_run(i,p,r,&local_30,0);
  if (iVar1 == 0) {
    p_00 = mpc_err_merge(i,local_30,r->error);
    for (lVar5 = 0; lVar5 < p_00->expected_num; lVar5 = lVar5 + 1) {
      pcVar2 = (char *)mpc_export(i,p_00->expected[lVar5]);
      p_00->expected[lVar5] = pcVar2;
    }
    ppcVar3 = (char **)mpc_export(i,p_00->expected);
    p_00->expected = ppcVar3;
    pcVar2 = (char *)mpc_export(i,p_00->filename);
    p_00->filename = pcVar2;
    pcVar2 = (char *)mpc_export(i,p_00->failure);
    p_00->failure = pcVar2;
  }
  else {
    mpc_err_delete_internal(i,local_30);
    p_00 = (mpc_err_t *)r->output;
  }
  pvVar4 = mpc_export(i,p_00);
  r->output = pvVar4;
  return iVar1;
}

Assistant:

int mpc_parse_input(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r) {
  int x;
  mpc_err_t *e = mpc_err_fail(i, "Unknown Error");
  e->state = mpc_state_invalid();
  x = mpc_parse_run(i, p, r, &e, 0);
  if (x) {
    mpc_err_delete_internal(i, e);
    r->output = mpc_export(i, r->output);
  } else {
    r->error = mpc_err_export(i, mpc_err_merge(i, e, r->error));
  }
  return x;
}